

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall FStat::~FStat(FStat *this)

{
  bool bVar1;
  FStat **local_18;
  FStat **prev;
  FStat *this_local;
  
  this->_vptr_FStat = (_func_int **)&PTR__FStat_00b6e7e8;
  local_18 = &FirstStat;
  while( true ) {
    bVar1 = false;
    if (*local_18 != (FStat *)0x0) {
      bVar1 = *local_18 != this;
    }
    if (!bVar1) break;
    local_18 = &(*local_18)->m_Next->m_Next;
  }
  if (*local_18 == this) {
    *local_18 = this->m_Next;
  }
  return;
}

Assistant:

FStat::~FStat ()
{
	FStat **prev = &FirstStat;

	while (*prev && *prev != this)
		prev = &((*prev)->m_Next)->m_Next;

	if (*prev == this)
		*prev = m_Next;
}